

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  float fVar1;
  undefined8 uVar2;
  uint uVar3;
  uint _c;
  Mat *pMVar4;
  void *pvVar5;
  pointer pMVar6;
  undefined1 auVar7 [12];
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  uint _h;
  ulong uVar13;
  int iVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  pointer pRVar18;
  long lVar19;
  undefined8 *puVar20;
  undefined8 *puVar21;
  void *pvVar22;
  pointer pRVar23;
  int j;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  void *pvVar27;
  value_type_conflict4 *__x;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  int local_24c;
  Mat pbs;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  Mat proposals;
  void *local_160;
  vector<float,_std::allocator<float>_> scores;
  vector<int,_std::allocator<int>_> picked;
  float local_f8;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = pMVar4->w;
  uVar26 = pMVar4->h;
  _c = (this->anchors).h;
  proposals.elemsize._0_4_ = 0;
  proposals.elemsize._4_4_ = 0;
  proposals.elempack = 0;
  proposals.data = (void *)0x0;
  proposals.refcount._0_4_ = 0;
  proposals.refcount._4_4_ = 0;
  proposals.allocator = (Allocator *)0x0;
  proposals.dims = 0;
  proposals.w = 0;
  proposals.h = 0;
  proposals.c = 0;
  proposals.cstep = 0;
  _h = uVar26 * uVar3;
  uVar17 = 0;
  Mat::create(&proposals,4,_h,_c,4,(Allocator *)0x0);
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  this_00 = pMVar4 + 1;
  uVar13 = (ulong)uVar26;
  if ((int)uVar26 < 1) {
    uVar13 = uVar17;
  }
  uVar9 = 0;
  if (0 < (int)_c) {
    uVar9 = (ulong)_c;
  }
  lVar12 = (long)(int)uVar3 * 4;
  for (; uVar17 != uVar9; uVar17 = uVar17 + 1) {
    uVar26 = (int)uVar17 * 4;
    Mat::channel(&pbs,this_00,uVar26);
    local_160 = pbs.data;
    Mat::~Mat(&pbs);
    Mat::channel(&pbs,this_00,uVar26 | 1);
    pvVar15 = pbs.data;
    Mat::~Mat(&pbs);
    Mat::channel(&pbs,this_00,uVar26 | 2);
    pvVar22 = pbs.data;
    Mat::~Mat(&pbs);
    Mat::channel(&pbs,this_00,uVar26 | 3);
    pvVar27 = pbs.data;
    Mat::~Mat(&pbs);
    pbs.elemsize = CONCAT44(proposals.elemsize._4_4_,(undefined4)proposals.elemsize);
    pbs.data = (void *)(proposals.cstep * uVar17 * pbs.elemsize + (long)proposals.data);
    pbs.refcount = (int *)0x0;
    pbs.elempack = proposals.elempack;
    pbs.allocator = proposals.allocator;
    pbs.dims = 2;
    pbs.w = proposals.w;
    pbs.h = proposals.h;
    pbs.c = 1;
    pbs.cstep = (size_t)(proposals.h * proposals.w);
    lVar19 = (long)(int)uVar17 * (long)(this->anchors).w * (this->anchors).elemsize;
    pvVar5 = (this->anchors).data;
    local_f8 = (float)((ulong)*(undefined8 *)((long)pvVar5 + lVar19) >> 0x20);
    uVar2 = *(undefined8 *)((long)pvVar5 + lVar19 + 8);
    fVar35 = (float)uVar2 - (float)*(undefined8 *)((long)pvVar5 + lVar19);
    fVar36 = (float)((ulong)uVar2 >> 0x20) - local_f8;
    iVar14 = this->feat_stride;
    fVar34 = fVar36 * 0.5;
    lVar16 = (long)proposals.w * pbs.elemsize;
    puVar20 = (undefined8 *)(proposals.cstep * pbs.elemsize * uVar17 + (long)proposals.data);
    for (uVar10 = 0; uVar10 != uVar13; uVar10 = uVar10 + 1) {
      iVar24 = this->feat_stride;
      fVar37 = *(float *)((long)pvVar5 + lVar19);
      puVar21 = puVar20;
      for (uVar25 = 0; uVar8 != uVar25; uVar25 = uVar25 + 1) {
        fVar30 = *(float *)((long)pvVar27 + uVar25 * 4);
        fVar38 = *(float *)((long)local_160 + uVar25 * 4);
        fVar39 = *(float *)((long)pvVar15 + uVar25 * 4);
        fVar29 = expf(*(float *)((long)pvVar22 + uVar25 * 4));
        fVar30 = expf(fVar30);
        fVar38 = (fVar38 + 0.5) * fVar35 + fVar37;
        fVar39 = (fVar39 + 0.5) * fVar36 + local_f8;
        fVar29 = fVar29 * fVar35 * 0.5;
        fVar30 = fVar30 * fVar34;
        auVar31._4_4_ = fVar30;
        auVar31._0_4_ = fVar29;
        auVar31._8_4_ = fVar38;
        auVar31._12_4_ = fVar39;
        auVar7._4_8_ = auVar31._8_8_;
        auVar7._0_4_ = fVar30 + local_f8 * fVar34;
        auVar32._0_8_ = auVar7._0_8_ << 0x20;
        auVar32._8_4_ = fVar38 + fVar29;
        auVar32._12_4_ = fVar39 + fVar30;
        *puVar21 = CONCAT44(fVar39 - fVar30,fVar38 - fVar29);
        puVar21[1] = auVar32._8_8_;
        fVar37 = fVar37 + (float)iVar24;
        puVar21 = (undefined8 *)((long)puVar21 + lVar16);
      }
      local_f8 = local_f8 + (float)iVar14;
      pvVar27 = (void *)((long)pvVar27 + lVar12);
      pvVar22 = (void *)((long)pvVar22 + lVar12);
      pvVar15 = (void *)((long)pvVar15 + lVar12);
      local_160 = (void *)((long)local_160 + lVar12);
      puVar20 = (undefined8 *)((long)puVar20 + lVar16 * (int)uVar3);
    }
    Mat::~Mat(&pbs);
  }
  fVar34 = (float)*pMVar4[2].data;
  fVar35 = (float)((ulong)*pMVar4[2].data >> 0x20);
  uVar17 = 0;
  uVar8 = (ulong)_h;
  if ((int)_h < 1) {
    uVar8 = uVar17;
  }
  for (; uVar17 != uVar9; uVar17 = uVar17 + 1) {
    pbs.elemsize = CONCAT44(proposals.elemsize._4_4_,(undefined4)proposals.elemsize);
    pbs.data = (void *)(proposals.cstep * uVar17 * pbs.elemsize + (long)proposals.data);
    pbs.refcount = (int *)0x0;
    pbs.elempack = proposals.elempack;
    pbs.allocator = proposals.allocator;
    pbs.dims = 2;
    pbs.w = proposals.w;
    pbs.h = proposals.h;
    pbs.c = 1;
    pbs.cstep = (size_t)(proposals.h * proposals.w);
    pauVar11 = (undefined1 (*) [16])(proposals.cstep * pbs.elemsize * uVar17 + (long)proposals.data)
    ;
    uVar13 = uVar8;
    while (bVar28 = uVar13 != 0, uVar13 = uVar13 - 1, bVar28) {
      auVar33._4_4_ = fVar34 + -1.0;
      auVar33._0_4_ = fVar35 + -1.0;
      auVar33._8_4_ = fVar35 + -1.0;
      auVar33._12_4_ = fVar34 + -1.0;
      auVar33 = minps(*pauVar11,auVar33);
      auVar33 = maxps(auVar33,ZEXT816(0));
      *pauVar11 = auVar33;
      pauVar11 = (undefined1 (*) [16])(*pauVar11 + (long)proposals.w * pbs.elemsize);
    }
    Mat::~Mat(&pbs);
  }
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  fVar34 = (float)this->min_size * *(float *)((long)pMVar4[2].data + 8);
  for (uVar17 = 0; uVar17 != uVar9; uVar17 = uVar17 + 1) {
    pbs.elemsize = CONCAT44(proposals.elemsize._4_4_,(undefined4)proposals.elemsize);
    pbs.data = (void *)(proposals.cstep * uVar17 * pbs.elemsize + (long)proposals.data);
    pbs.refcount = (int *)0x0;
    pbs.elempack = proposals.elempack;
    pbs.allocator = proposals.allocator;
    pbs.dims = 2;
    pbs.w = proposals.w;
    pbs.h = proposals.h;
    pbs.c = 1;
    pbs.cstep = (size_t)(proposals.h * proposals.w);
    Mat::channel((Mat *)&picked,pMVar4,_c + (int)uVar17);
    __x = (value_type_conflict4 *)
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    Mat::~Mat((Mat *)&picked);
    for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      lVar12 = (long)(int)uVar13 * (long)pbs.w * pbs.elemsize;
      if ((fVar34 <= (*(float *)((long)pbs.data + lVar12 + 8) + 1.0) -
                     *(float *)((long)pbs.data + lVar12)) &&
         (fVar34 <= (*(float *)((long)pbs.data + lVar12 + 0xc) + 1.0) -
                    *(float *)((long)pbs.data + lVar12 + 4))) {
        picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(*(undefined4 *)((long)pbs.data + lVar12 + 4),
                                     *(float *)((long)pbs.data + lVar12));
        picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)CONCAT44(*(undefined4 *)((long)pbs.data + lVar12 + 0xc),
                                      *(undefined4 *)((long)pbs.data + lVar12 + 8));
        std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::push_back
                  (&proposal_boxes,(value_type *)&picked);
        std::vector<float,_std::allocator<float>_>::push_back(&scores,__x);
      }
      __x = __x + 1;
    }
    Mat::~Mat(&pbs);
  }
  if (proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start !=
      proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      qsort_descent_inplace<ncnn::Rect>
                (&proposal_boxes,&scores,0,
                 (int)((ulong)((long)scores.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)scores.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                    .super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar14 = this->pre_nms_topN;
  if ((0 < (long)iVar14) &&
     (iVar14 < (int)((ulong)((long)proposal_boxes.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)proposal_boxes.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&proposal_boxes,(long)iVar14);
    std::vector<float,_std::allocator<float>_>::resize(&scores,(long)this->pre_nms_topN);
  }
  picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  fVar34 = this->nms_thresh;
  uVar17 = (ulong)((long)proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 4;
  iVar14 = (int)uVar17;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&pbs,(long)iVar14,(allocator_type *)&local_24c
            );
  lVar12 = 0;
  uVar8 = 0;
  if (0 < iVar14) {
    uVar8 = uVar17 & 0xffffffff;
  }
  for (; uVar8 * 4 != lVar12; lVar12 = lVar12 + 4) {
    *(float *)((long)pbs.data + lVar12) =
         ((float)((ulong)*(undefined8 *)
                          (&(proposal_boxes.
                             super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                             super__Vector_impl_data._M_start)->x2 + lVar12) >> 0x20) -
         (float)((ulong)*(undefined8 *)
                         (&(proposal_boxes.
                            super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                            super__Vector_impl_data._M_start)->x1 + lVar12) >> 0x20)) *
         ((float)*(undefined8 *)
                  (&(proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                     _M_impl.super__Vector_impl_data._M_start)->x2 + lVar12) -
         (float)*(undefined8 *)
                 (&(proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                    _M_impl.super__Vector_impl_data._M_start)->x1 + lVar12));
  }
  for (local_24c = 0; local_24c < iVar14; local_24c = local_24c + 1) {
    pRVar18 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_start + local_24c;
    uVar17 = (ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar8 = uVar17 & 0xffffffff;
    if ((int)uVar17 < 1) {
      uVar8 = 0;
    }
    uVar17 = 1;
    for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      lVar12 = (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
      fVar35 = pRVar18->x1;
      fVar36 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12].x2;
      fVar37 = 0.0;
      if (fVar35 <= fVar36) {
        pRVar23 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                  .super__Vector_impl_data._M_start + lVar12;
        fVar30 = pRVar18->x2;
        fVar38 = pRVar23->x1;
        if (fVar38 <= fVar30) {
          fVar39 = pRVar18->y1;
          fVar29 = pRVar23->y2;
          if (fVar39 <= fVar29) {
            fVar1 = pRVar18->y2;
            fVar40 = pRVar23->y1;
            if (fVar40 <= fVar1) {
              if (fVar30 <= fVar36) {
                fVar36 = fVar30;
              }
              if (fVar38 <= fVar35) {
                fVar38 = fVar35;
              }
              if (fVar1 <= fVar29) {
                fVar29 = fVar1;
              }
              if (fVar40 <= fVar39) {
                fVar40 = fVar39;
              }
              fVar37 = (fVar29 - fVar40) * (fVar36 - fVar38);
            }
          }
        }
      }
      if (fVar34 < fVar37 / ((*(float *)((long)pbs.data + (long)local_24c * 4) - fVar37) +
                            *(float *)((long)pbs.data + lVar12 * 4))) {
        uVar17 = 0;
      }
    }
    if ((int)uVar17 != 0) {
      std::vector<int,_std::allocator<int>_>::push_back(&picked,&local_24c);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&pbs);
  uVar8 = (ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar17 = uVar8 & 0xffffffff;
  if (this->after_nms_topN < (int)uVar8) {
    uVar17 = (ulong)(uint)this->after_nms_topN;
  }
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar14 = (int)uVar17;
  Mat::create(pMVar4,4,1,iVar14,4,(Allocator *)0x0);
  if ((pMVar4->data == (void *)0x0) || ((long)pMVar4->c * pMVar4->cstep == 0)) {
    iVar24 = -100;
  }
  else {
    uVar13 = 0;
    uVar8 = 0;
    if (0 < iVar14) {
      uVar8 = uVar17;
    }
    for (; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      Mat::channel(&pbs,pMVar4,(int)uVar13);
      pvVar5 = pbs.data;
      Mat::~Mat(&pbs);
      iVar24 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar13];
      *(float *)pvVar5 =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[iVar24].x1;
      *(float *)((long)pvVar5 + 4) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[iVar24].y1;
      *(float *)((long)pvVar5 + 8) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[iVar24].x2;
      *(float *)((long)pvVar5 + 0xc) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[iVar24].y2;
    }
    pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar24 = 0;
    if (0x40 < (ulong)((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6)) {
      pMVar4 = pMVar6 + 1;
      Mat::create(pMVar4,1,1,iVar14,4,(Allocator *)0x0);
      if (pMVar4->data == (void *)0x0) {
        iVar24 = -100;
      }
      else {
        iVar24 = -100;
        if ((long)pMVar6[1].c * pMVar6[1].cstep != 0) {
          iVar24 = 0;
          for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
            Mat::channel(&pbs,pMVar4,(int)uVar17);
            pvVar5 = pbs.data;
            Mat::~Mat(&pbs);
            *(float *)pvVar5 =
                 scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17]];
          }
        }
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&picked.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&scores.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>::~_Vector_base
            (&proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>);
  Mat::~Mat(&proposals);
  return iVar24;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * exp(dw);
                float pb_h = anchor_h * exp(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<int> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}